

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataCollection::CollectionWithinCollectionComputeHeapSizes
               (Vector *heap_sizes_v,Vector *source_v,TupleDataVectorFormat *source_format,
               SelectionVector *append_sel,idx_t append_count,UnifiedVectorFormat *list_data)

{
  long lVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  _Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_> __ptr
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  reference source_format_00;
  _Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
  this_00;
  type list_data_00;
  TemplatedValidityData<unsigned_long> *pTVar12;
  long lVar13;
  Vector *source_v_00;
  SelectionVector *pSVar14;
  ulong uVar15;
  int iVar16;
  idx_t iVar17;
  long lVar18;
  ulong uVar19;
  idx_t iVar20;
  ulong uVar21;
  pointer __p;
  long lVar22;
  uint64_t uVar23;
  ulong uVar24;
  unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true> *this_01
  ;
  uint64_t uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  SelectionVector combined_sel;
  SelectionVector list_sel;
  SelectionVector child_list_sel;
  SelectionVector local_d0;
  undefined1 local_b8 [24];
  unsigned_long *local_a0;
  unsigned_long *local_98;
  sel_t *local_90;
  sel_t *local_88;
  idx_t local_80;
  data_ptr_t local_78;
  ulong local_70;
  sel_t *local_68;
  __shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> local_60;
  sel_t *local_50;
  __shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> local_48;
  idx_t local_38;
  long lVar28;
  
  pSVar14 = list_data->sel;
  local_60._M_ptr = (element_type *)0x0;
  local_60._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  shared_ptr<duckdb::SelectionData,_true>::operator=
            ((shared_ptr<duckdb::SelectionData,_true> *)&local_60,&pSVar14->selection_data);
  local_68 = pSVar14->sel_vector;
  pdVar2 = list_data->data;
  pSVar14 = (source_format->unified).sel;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  shared_ptr<duckdb::SelectionData,_true>::operator=
            ((shared_ptr<duckdb::SelectionData,_true> *)&local_48,&pSVar14->selection_data);
  local_50 = pSVar14->sel_vector;
  pdVar3 = (source_format->unified).data;
  if (append_count == 0) {
    uVar24 = 0;
  }
  else {
    puVar4 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar5 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
             validity_mask;
    uVar24 = 0;
    iVar17 = 0;
    do {
      iVar20 = iVar17;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar20 = (idx_t)append_sel->sel_vector[iVar17];
      }
      if (local_68 != (sel_t *)0x0) {
        iVar20 = (idx_t)local_68[iVar20];
      }
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar20 >> 6] >> (iVar20 & 0x3f) & 1) != 0)) {
        lVar18 = *(long *)(pdVar2 + iVar20 * 0x10 + 8);
        if (lVar18 != 0) {
          uVar21 = *(ulong *)(pdVar2 + iVar20 * 0x10);
          do {
            uVar15 = uVar21;
            if (local_50 != (sel_t *)0x0) {
              uVar15 = (ulong)local_50[uVar21];
            }
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) {
              uVar24 = uVar24 + *(long *)(pdVar3 + uVar15 * 0x10 + 8);
            }
            uVar21 = uVar21 + 1;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != append_count);
  }
  local_78 = heap_sizes_v->data;
  if ((source_v->type).physical_type_ == LIST) {
    uVar21 = ListVector::GetListSize(source_v);
  }
  else {
    uVar21 = ArrayVector::GetTotalSize(source_v);
  }
  if (uVar21 < uVar24) {
    uVar21 = uVar24;
  }
  source_format_00 =
       vector<duckdb::TupleDataVectorFormat,_true>::operator[](&source_format->children,0);
  this_01 = &source_format_00->combined_list_data;
  if ((source_format_00->combined_list_data).
      super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
      .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl ==
      (CombinedListData *)0x0) {
    this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::CombinedListData_*,_false>)operator_new(0x8078);
    UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)
               this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl);
    *(undefined1 (*) [16])
     ((long)this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x48) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x8058)
         = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x8068)
         = 0;
    *(undefined8 *)
     ((long)this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x8070)
         = 0x800;
    local_d0.sel_vector = (sel_t *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl =
         (this_01->
         super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
         .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>;
    (this_01->
    super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>)._M_t
    .super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
    .super__Head_base<0UL,_duckdb::CombinedListData_*,_false> =
         this_00.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl !=
        (CombinedListData *)0x0) {
      ::std::default_delete<duckdb::CombinedListData>::operator()
                ((default_delete<duckdb::CombinedListData> *)this_01,
                 (CombinedListData *)
                 __ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl);
    }
    if ((CombinedListData *)local_d0.sel_vector != (CombinedListData *)0x0) {
      ::std::default_delete<duckdb::CombinedListData>::operator()
                ((default_delete<duckdb::CombinedListData> *)&local_d0,
                 (CombinedListData *)local_d0.sel_vector);
    }
  }
  list_data_00 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
                 ::operator*(this_01);
  SelectionVector::SelectionVector(&local_d0,uVar21);
  if (uVar21 != 0) {
    switchD_0105b559::default(local_d0.sel_vector,0,uVar21 * 4);
  }
  if ((list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    local_38 = (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.capacity
    ;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)local_b8,&local_38);
    uVar10 = local_b8._0_8_;
    uVar11 = local_b8._8_8_;
    local_b8._0_16_ = (undefined1  [16])0x0;
    this = (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.
           validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
    internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar10;
    (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
    internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                        (&(list_data_00->combined_validity).
                          super_TemplatedValidityMask<unsigned_long>.validity_data);
    (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (pTVar12->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
  }
  local_a0 = (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.
             validity_mask;
  switchD_0105b559::default(local_a0,0xff,0x100);
  auVar9 = _DAT_01df1070;
  auVar8 = _DAT_01de8e80;
  if (append_count != 0) {
    local_88 = append_sel->sel_vector;
    local_98 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar4 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
             validity_mask;
    uVar23 = 0;
    uVar24 = 0;
    local_90 = local_68;
    do {
      uVar15 = uVar24;
      if (local_88 != (sel_t *)0x0) {
        uVar15 = (ulong)local_88[uVar24];
      }
      uVar19 = uVar15;
      if (local_68 != (sel_t *)0x0) {
        uVar19 = (ulong)local_68[uVar15];
      }
      if ((local_98 == (unsigned_long *)0x0) ||
         ((local_98[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) {
        lVar13 = uVar19 * 0x10;
        lVar18 = (*(long *)(pdVar2 + lVar13 + 8) + 7U >> 3) + *(long *)(local_78 + uVar24 * 8);
        *(long *)(local_78 + uVar24 * 8) = lVar18;
        *(long *)(local_78 + uVar24 * 8) = lVar18 + *(long *)(pdVar2 + lVar13 + 8) * 8;
        lVar18 = *(long *)(pdVar2 + lVar13 + 8);
        if (lVar18 == 0) {
          uVar25 = 0;
        }
        else {
          lVar13 = *(long *)(pdVar2 + lVar13);
          lVar22 = 0;
          uVar25 = 0;
          do {
            uVar19 = lVar13 + lVar22;
            if (local_50 != (sel_t *)0x0) {
              uVar19 = (ulong)local_50[uVar19];
            }
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) {
              lVar6 = *(long *)(pdVar3 + uVar19 * 0x10 + 8);
              if (lVar6 != 0) {
                iVar16 = *(int *)(pdVar3 + uVar19 * 0x10);
                lVar1 = lVar6 + -1;
                auVar26._8_4_ = (int)lVar1;
                auVar26._0_8_ = lVar1;
                auVar26._12_4_ = (int)((ulong)lVar1 >> 0x20);
                lVar1 = uVar25 * 4 + uVar23 * 4 + 4;
                auVar26 = auVar26 ^ auVar8;
                uVar19 = 0;
                auVar27 = auVar9;
                do {
                  auVar29 = auVar27 ^ auVar8;
                  if ((bool)(~(auVar26._4_4_ < auVar29._4_4_ ||
                              auVar26._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar26._4_4_) & 1))
                  {
                    *(int *)((long)((long)local_d0.sel_vector + 0x58) + uVar19 * 4 + lVar1 + -0x5c)
                         = iVar16;
                  }
                  if (auVar29._12_4_ <= auVar26._12_4_ &&
                      (auVar29._8_4_ <= auVar26._8_4_ || auVar29._12_4_ != auVar26._12_4_)) {
                    *(int *)((long)((long)local_d0.sel_vector + 0x58) + uVar19 * 4 + lVar1 + -0x58)
                         = iVar16 + 1;
                  }
                  uVar19 = uVar19 + 2;
                  lVar28 = auVar27._8_8_;
                  auVar27._0_8_ = auVar27._0_8_ + 2;
                  auVar27._8_8_ = lVar28 + 2;
                  iVar16 = iVar16 + 2;
                } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar19);
                uVar25 = uVar25 + lVar6;
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != lVar18);
        }
        list_data_00->combined_list_entries[uVar15].offset = uVar23;
        list_data_00->combined_list_entries[uVar15].length = uVar25;
        uVar23 = uVar23 + uVar25;
        local_70 = uVar24;
      }
      else {
        bVar7 = (byte)uVar15 & 0x3f;
        local_a0[uVar15 >> 6] =
             local_a0[uVar15 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar24 = uVar24 + 1;
      local_80 = append_count;
    } while (uVar24 != append_count);
  }
  if ((source_v->type).physical_type_ == LIST) {
    source_v_00 = ListVector::GetEntry(source_v);
  }
  else {
    source_v_00 = ArrayVector::GetEntry(source_v);
  }
  ApplySliceRecursive(source_v_00,source_format_00,&local_d0,uVar21);
  pSVar14 = FlatVector::IncrementalSelectionVector();
  (list_data_00->combined_data).sel = pSVar14;
  (list_data_00->combined_data).data = (data_ptr_t)list_data_00->combined_list_entries;
  (list_data_00->combined_data).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(list_data_00->combined_data).validity.super_TemplatedValidityMask<unsigned_long>.
              validity_data,
             &(list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.
              validity_data);
  (list_data_00->combined_data).validity.super_TemplatedValidityMask<unsigned_long>.capacity =
       (list_data_00->combined_validity).super_TemplatedValidityMask<unsigned_long>.capacity;
  WithinCollectionComputeHeapSizes
            (heap_sizes_v,source_v_00,source_format_00,append_sel,append_count,
             &list_data_00->combined_data);
  if (local_d0.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
  }
  if (local_60._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_refcount._M_pi);
  }
  return;
}

Assistant:

void TupleDataCollection::CollectionWithinCollectionComputeHeapSizes(Vector &heap_sizes_v, const Vector &source_v,
                                                                     TupleDataVectorFormat &source_format,
                                                                     const SelectionVector &append_sel,
                                                                     const idx_t append_count,
                                                                     const UnifiedVectorFormat &list_data) {
	// Parent list data
	const auto list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &child_list_data = source_format.unified;
	const auto child_list_sel = *child_list_data.sel;
	const auto child_list_entries = UnifiedVectorFormat::GetData<list_entry_t>(child_list_data);
	const auto &child_list_validity = child_list_data.validity;

	// Target
	auto heap_sizes = FlatVector::GetData<idx_t>(heap_sizes_v);

	// Figure out actual child list size (can differ from ListVector::GetListSize if dict/const vector),
	// and we cannot use ConstantVector::ZeroSelectionVector because it may need to be longer than STANDARD_VECTOR_SIZE
	idx_t sum_of_sizes = 0;
	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue;
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (!child_list_validity.RowIsValid(child_list_idx)) {
				continue;
			}

			const auto &child_list_entry = child_list_entries[child_list_idx];
			const auto &child_list_length = child_list_entry.length;

			sum_of_sizes += child_list_length;
		}
	}

	const auto child_list_child_count = MaxValue<idx_t>(
	    sum_of_sizes, source_v.GetType().InternalType() == PhysicalType::LIST ? ListVector::GetListSize(source_v)
	                                                                          : ArrayVector::GetTotalSize(source_v));

	D_ASSERT(source_format.children.size() == 1);
	auto &child_format = source_format.children[0];
#ifdef DEBUG
	// In debug mode this should be deleted by ResetCombinedListData
	D_ASSERT(!child_format.combined_list_data);
#endif
	if (!child_format.combined_list_data) {
		child_format.combined_list_data = make_uniq<CombinedListData>();
	}
	auto &combined_list_data = *child_format.combined_list_data;

	// Construct combined list entries and a selection/validity vector for the child list child
	SelectionVector combined_sel(child_list_child_count);
	for (idx_t i = 0; i < child_list_child_count; i++) {
		combined_sel.set_index(i, 0);
	}
	auto &combined_list_entries = combined_list_data.combined_list_entries;
	auto &combined_validity = combined_list_data.combined_validity;
	combined_validity.SetAllValid(STANDARD_VECTOR_SIZE);

	idx_t combined_list_offset = 0;
	for (idx_t i = 0; i < append_count; i++) {
		const auto append_idx = append_sel.get_index(i);
		const auto list_idx = list_sel.get_index(append_idx);
		if (!list_validity.RowIsValid(list_idx)) {
			combined_validity.SetInvalidUnsafe(append_idx);
			continue; // Original list entry is invalid - no need to serialize the child list
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;

		// Size is the validity mask and the list sizes
		auto &heap_size = heap_sizes[i];
		heap_size += ValidityBytes::SizeInBytes(list_length);
		heap_size += list_length * sizeof(uint64_t);

		idx_t child_list_size = 0;
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (child_list_validity.RowIsValid(child_list_idx)) {
				const auto &child_list_entry = child_list_entries[child_list_idx];
				const auto &child_list_offset = child_list_entry.offset;
				const auto &child_list_length = child_list_entry.length;
				if (child_list_length == 0) {
					continue;
				}

				// Add this child's list entries to the combined selection vector
				for (idx_t child_value_i = 0; child_value_i < child_list_length; child_value_i++) {
					auto idx = combined_list_offset + child_list_size + child_value_i;
					auto loc = child_list_offset + child_value_i;
					combined_sel.set_index(idx, loc);
				}

				child_list_size += child_list_length;
			}
		}

		// Combine the child list entries into one
		auto &combined_list_entry = combined_list_entries[append_idx];
		combined_list_entry.offset = combined_list_offset;
		combined_list_entry.length = child_list_size;
		combined_list_offset += child_list_size;
	}

	// TODO: Template this?
	auto &child_source = source_v.GetType().InternalType() == PhysicalType::LIST ? ListVector::GetEntry(source_v)
	                                                                             : ArrayVector::GetEntry(source_v);
	ApplySliceRecursive(child_source, child_format, combined_sel, child_list_child_count);

	// Create a combined child_list_data to be used as list_data in the recursion
	auto &combined_child_list_data = combined_list_data.combined_data;
	combined_child_list_data.sel = FlatVector::IncrementalSelectionVector();
	combined_child_list_data.data = data_ptr_cast(combined_list_entries);
	combined_child_list_data.validity.Initialize(combined_validity);

	// Recurse
	WithinCollectionComputeHeapSizes(heap_sizes_v, child_source, child_format, append_sel, append_count,
	                                 combined_child_list_data);
}